

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
jessilib::
word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,jessilib *this,char *begin,char *end,char *in_whitespace_begin,
          char *in_whitespace_end)

{
  bool bVar1;
  difference_type dVar2;
  char in_whitespace;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  bool local_b2;
  bool local_b1;
  size_t local_a0;
  char *local_98;
  size_t local_90;
  char *local_88;
  size_t local_80;
  char *local_78;
  char *local_70;
  char *itr;
  anon_class_16_2_5d41347b is_whitespace;
  char *local_50;
  undefined1 local_48 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  result;
  char *in_whitespace_end_local;
  char *in_whitespace_begin_local;
  char *end_local;
  char *begin_local;
  
  in_whitespace = (char)in_whitespace_begin;
  result.second._M_str = in_whitespace_begin;
  dVar2 = std::distance<char_const*>(end,in_whitespace_begin);
  if (dVar2 == 1) {
    word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char>
              (__return_storage_ptr__,this,begin,(char *)(ulong)(uint)(int)*end,in_whitespace);
  }
  else {
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)local_48);
    if (this < begin) {
      if (end < result.second._M_str) {
        is_whitespace.in_whitespace_begin = result.second._M_str;
        itr = end;
        end_local = (char *)this;
        while( true ) {
          local_b1 = false;
          if (end_local != begin) {
            local_b1 = word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
                       ::anon_class_16_2_5d41347b::operator()
                                 ((anon_class_16_2_5d41347b *)&itr,*end_local);
          }
          if (local_b1 == false) break;
          end_local = end_local + 1;
        }
        for (local_70 = end_local; local_70 < begin; local_70 = local_70 + 1) {
          bVar1 = word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
                  ::anon_class_16_2_5d41347b::operator()((anon_class_16_2_5d41347b *)&itr,*local_70)
          ;
          if (bVar1) {
            bVar3 = make_word_split_member<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_nullptr>
                              (end_local,local_70);
            local_80 = bVar3._M_len;
            local_48 = (undefined1  [8])local_80;
            local_78 = bVar3._M_str;
            result.first._M_len = (size_t)local_78;
            do {
              local_70 = local_70 + 1;
              local_b2 = false;
              if (local_70 != begin) {
                local_b2 = word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
                           ::anon_class_16_2_5d41347b::operator()
                                     ((anon_class_16_2_5d41347b *)&itr,*local_70);
              }
            } while (local_b2 != false);
            bVar3 = make_word_split_member<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_nullptr>
                              (local_70,begin);
            local_90 = bVar3._M_len;
            local_88 = bVar3._M_str;
            (__return_storage_ptr__->first)._M_len = (size_t)local_48;
            (__return_storage_ptr__->first)._M_str = (char *)result.first._M_len;
            (__return_storage_ptr__->second)._M_len = local_90;
            (__return_storage_ptr__->second)._M_str = local_88;
            return __return_storage_ptr__;
          }
        }
        bVar3 = make_word_split_member<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_nullptr>
                          (end_local,begin);
        local_a0 = bVar3._M_len;
        local_98 = bVar3._M_str;
        (__return_storage_ptr__->first)._M_len = local_a0;
        (__return_storage_ptr__->first)._M_str = local_98;
        (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
        (__return_storage_ptr__->second)._M_str = (char *)result.second._M_len;
      }
      else {
        bVar3 = make_word_split_member<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_nullptr>
                          ((char *)this,begin);
        is_whitespace.in_whitespace_end = (char *)bVar3._M_len;
        local_50 = bVar3._M_str;
        (__return_storage_ptr__->first)._M_len = (size_t)is_whitespace.in_whitespace_end;
        (__return_storage_ptr__->first)._M_str = local_50;
        (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
        (__return_storage_ptr__->second)._M_str = (char *)result.second._M_len;
      }
    }
    else {
      (__return_storage_ptr__->first)._M_len = (size_t)local_48;
      (__return_storage_ptr__->first)._M_str = (char *)result.first._M_len;
      (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
      (__return_storage_ptr__->second)._M_str = (char *)result.second._M_len;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, SpaceItrT in_whitespace_begin, SpaceEndT in_whitespace_end) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using ElementT = std::remove_cvref_t<decltype(*begin)>;
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	if (std::distance(in_whitespace_begin, in_whitespace_end) == 1) {
		return word_split_once<OptionalMemberT...>(begin, end, *in_whitespace_begin);
	}

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	if (in_whitespace_begin >= in_whitespace_end) {
		// Absent whitespace, therefore no match, therefore return input as single token
		result.first = make_word_split_member<MemberT>(begin, end);
		return result;
	}

	auto is_whitespace = [in_whitespace_begin, in_whitespace_end](ElementT in_element) {
		return std::find(in_whitespace_begin, in_whitespace_end, in_element) != in_whitespace_end;
	};

	// Skip over preceeding whitespace
	while (begin != end
		&& is_whitespace(*begin)) {
		++begin;
	}

	for (auto itr = begin; itr < end; ++itr) {
		if (is_whitespace(*itr)) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& is_whitespace(*itr)) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}